

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 crnd::crnd_get_segmented_file_size(void *pData,uint32 data_size)

{
  ushort uVar1;
  crn_header *pcVar2;
  uint uVar3;
  uint uVar4;
  
  if ((data_size < 0x3e || pData == (void *)0x0) ||
     (pcVar2 = crnd_get_header(pData,data_size), pcVar2 == (crn_header *)0x0)) {
    uVar3 = 0;
  }
  else {
    uVar1 = *(ushort *)(pcVar2->m_header_size).m_buf;
    uVar3 = ((uint)(pcVar2->m_color_endpoints).m_size.m_buf[2] |
            (uint)(pcVar2->m_color_endpoints).m_size.m_buf[1] << 8 |
            (uint)(pcVar2->m_color_endpoints).m_size.m_buf[0] << 0x10) +
            ((uint)(pcVar2->m_color_endpoints).m_ofs.m_buf[2] |
            (uint)(pcVar2->m_color_endpoints).m_ofs.m_buf[1] << 8 |
            (uint)(pcVar2->m_color_endpoints).m_ofs.m_buf[0] << 0x10);
    uVar4 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
    uVar4 = ((uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
            (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
            (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10) +
            ((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
            (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8 |
            (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10);
    if (uVar4 < uVar3) {
      uVar4 = uVar3;
    }
    uVar3 = ((uint)(pcVar2->m_alpha_endpoints).m_size.m_buf[2] |
            (uint)(pcVar2->m_alpha_endpoints).m_size.m_buf[1] << 8 |
            (uint)(pcVar2->m_alpha_endpoints).m_size.m_buf[0] << 0x10) +
            ((uint)(pcVar2->m_alpha_endpoints).m_ofs.m_buf[2] |
            (uint)(pcVar2->m_alpha_endpoints).m_ofs.m_buf[1] << 8 |
            (uint)(pcVar2->m_alpha_endpoints).m_ofs.m_buf[0] << 0x10);
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
    uVar1 = *(ushort *)(pcVar2->m_tables_size).m_buf;
    uVar4 = ((uint)(pcVar2->m_alpha_selectors).m_size.m_buf[2] |
            (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[1] << 8 |
            (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[0] << 0x10) +
            ((uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[2] |
            (uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[1] << 8 |
            (uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[0] << 0x10);
    if (uVar4 < uVar3) {
      uVar4 = uVar3;
    }
    uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) +
            ((uint)(pcVar2->m_tables_ofs).m_buf[2] |
            (uint)(pcVar2->m_tables_ofs).m_buf[1] << 8 |
            (uint)(pcVar2->m_tables_ofs).m_buf[0] << 0x10);
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
  }
  return uVar3;
}

Assistant:

uint32 crnd_get_segmented_file_size(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return NULL;

        uint32 size = pHeader->m_header_size;

        size = math::maximum(size, pHeader->m_color_endpoints.m_ofs + pHeader->m_color_endpoints.m_size);
        size = math::maximum(size, pHeader->m_color_selectors.m_ofs + pHeader->m_color_selectors.m_size);
        size = math::maximum(size, pHeader->m_alpha_endpoints.m_ofs + pHeader->m_alpha_endpoints.m_size);
        size = math::maximum(size, pHeader->m_alpha_selectors.m_ofs + pHeader->m_alpha_selectors.m_size);
        size = math::maximum(size, pHeader->m_tables_ofs + pHeader->m_tables_size);

        return size;
    }